

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDie.cpp
# Opt level: O0

void __thiscall
llvm::DWARFDie::dump(DWARFDie *this,raw_ostream *OS,uint Indent,DIDumpOptions DumpOpts)

{
  DIDumpOptions DumpOpts_00;
  DIDumpOptions DVar1;
  bool bVar2;
  uint64_t uVar3;
  raw_ostream *prVar4;
  AttributeSpec *pAVar5;
  char *in_R8;
  undefined1 local_23b;
  DIDumpOptions ChildDumpOpts;
  DWARFDie child;
  AttributeSpec *AttrSpec;
  AttributeSpec *__end4;
  AttributeSpec *__begin4;
  iterator_range<const_llvm::DWARFAbbreviationDeclaration::AttributeSpec_*> *local_170;
  attr_iterator_range *__range4;
  format_object<unsigned_int,_char> local_160;
  Tag local_142;
  formatv_object<std::tuple<llvm::detail::provider_format_adapter<llvm::dwarf::Tag>_>_> local_140;
  WithColor local_f0;
  DWARFAbbreviationDeclaration *local_e0;
  DWARFAbbreviationDeclaration *AbbrevDecl;
  WithColor local_b0;
  uint local_9c;
  undefined1 auStack_98 [4];
  uint32_t abbrCode;
  uint local_90;
  uint uStack_8c;
  uint local_88;
  uint16_t uStack_84;
  uint8_t uStack_82;
  bool bStack_81;
  DWARFDie local_80;
  undefined1 local_70 [8];
  DIDumpOptions ParentDumpOpts;
  uint64_t offset;
  uint64_t Offset;
  DWARFDataExtractor debug_info_data;
  uint Indent_local;
  raw_ostream *OS_local;
  DWARFDie *this_local;
  
  DVar1 = DumpOpts;
  debug_info_data.Section._4_4_ = Indent;
  bVar2 = isValid(this);
  if (bVar2) {
    DWARFUnit::getDebugInfoExtractor((DWARFDataExtractor *)&Offset,this->U);
    ParentDumpOpts._16_8_ = getOffset(this);
    offset = ParentDumpOpts._16_8_;
    if (((undefined1  [24])DumpOpts & (undefined1  [24])0x100) != (undefined1  [24])0x0) {
      local_70._0_4_ = DumpOpts.DumpType;
      local_70._4_4_ = DumpOpts.ChildRecurseDepth;
      ParentDumpOpts._0_8_ = DumpOpts._8_8_;
      ParentDumpOpts._8_8_ = DumpOpts._16_8_ & 0xffffffffffff0000;
      local_80 = getParent(this);
      auStack_98 = (undefined1  [4])local_70._0_4_;
      abbrCode = local_70._4_4_;
      local_90 = ParentDumpOpts.DumpType;
      uStack_8c = ParentDumpOpts.ChildRecurseDepth;
      local_88 = ParentDumpOpts.ParentRecurseDepth;
      uStack_84 = ParentDumpOpts.Version;
      uStack_82 = ParentDumpOpts.AddrSize;
      bStack_81 = ParentDumpOpts.ShowAddresses;
      in_R8 = (char *)0x0;
      DumpOpts_00._8_8_ = ParentDumpOpts._0_8_;
      DumpOpts_00.DumpType = local_70._0_4_;
      DumpOpts_00.ChildRecurseDepth = local_70._4_4_;
      DumpOpts_00._16_8_ = ParentDumpOpts._8_8_;
      debug_info_data.Section._4_4_ =
           dumpParentChain(local_80,OS,debug_info_data.Section._4_4_,DumpOpts_00,0);
    }
    bVar2 = DataExtractor::isValidOffset((DataExtractor *)&Offset,ParentDumpOpts._16_8_);
    if (bVar2) {
      uVar3 = DataExtractor::getULEB128
                        ((DataExtractor *)&Offset,(uint64_t *)&ParentDumpOpts.ShowChildren,
                         (Error *)0x0);
      local_9c = (uint)uVar3;
      if (((undefined1  [24])DVar1 & (undefined1  [24])0x100000000000000) != (undefined1  [24])0x0)
      {
        WithColor::WithColor(&local_b0,OS,Address,false);
        prVar4 = WithColor::get(&local_b0);
        format<unsigned_long>((format_object<unsigned_long> *)&AbbrevDecl,"\n0x%8.8lx: ",&offset);
        raw_ostream::operator<<(prVar4,(format_object_base *)&AbbrevDecl);
        WithColor::~WithColor(&local_b0);
      }
      if (local_9c == 0) {
        prVar4 = raw_ostream::indent(OS,debug_info_data.Section._4_4_);
        raw_ostream::operator<<(prVar4,"NULL\n");
      }
      else {
        local_e0 = getAbbreviationDeclarationPtr(this);
        if (local_e0 == (DWARFAbbreviationDeclaration *)0x0) {
          prVar4 = raw_ostream::operator<<
                             (OS,"Abbreviation code not found in \'debug_abbrev\' class for code: ")
          ;
          prVar4 = raw_ostream::operator<<(prVar4,local_9c);
          raw_ostream::operator<<(prVar4,'\n');
        }
        else {
          WithColor::WithColor(&local_f0,OS,Tag,false);
          prVar4 = WithColor::get(&local_f0);
          prVar4 = raw_ostream::indent(prVar4,debug_info_data.Section._4_4_);
          local_142 = getTag(this);
          formatv<llvm::dwarf::Tag>(&local_140,"{0}",&local_142);
          raw_ostream::operator<<(prVar4,&local_140.super_formatv_object_base);
          formatv_object<std::tuple<llvm::detail::provider_format_adapter<llvm::dwarf::Tag>_>_>::
          ~formatv_object(&local_140);
          WithColor::~WithColor(&local_f0);
          if (((undefined1  [24])DVar1 & (undefined1  [24])0x100000000) != (undefined1  [24])0x0) {
            bVar2 = DWARFAbbreviationDeclaration::hasChildren(local_e0);
            local_23b = 0x2a;
            if (!bVar2) {
              local_23b = 0x20;
            }
            __range4._7_1_ = local_23b;
            format<unsigned_int,char>
                      (&local_160,(llvm *)" [%u] %c",(char *)&local_9c,(uint *)((long)&__range4 + 7)
                       ,in_R8);
            raw_ostream::operator<<(OS,&local_160.super_format_object_base);
          }
          raw_ostream::operator<<(OS,'\n');
          ___begin4 = DWARFAbbreviationDeclaration::attributes(local_e0);
          local_170 = (iterator_range<const_llvm::DWARFAbbreviationDeclaration::AttributeSpec_*> *)
                      &__begin4;
          __end4 = iterator_range<const_llvm::DWARFAbbreviationDeclaration::AttributeSpec_*>::begin
                             (local_170);
          pAVar5 = iterator_range<const_llvm::DWARFAbbreviationDeclaration::AttributeSpec_*>::end
                             (local_170);
          for (; __end4 != pAVar5; __end4 = __end4 + 1) {
            if (__end4->Form != DW_FORM_implicit_const) {
              dumpAttribute(OS,this,(uint64_t *)&ParentDumpOpts.ShowChildren,__end4->Attr,
                            __end4->Form,debug_info_data.Section._4_4_,DVar1);
            }
          }
          join_0x00000010_0x00000000_ = getFirstChild(this);
          if (((((undefined1  [24])DVar1 & (undefined1  [24])0x1) != (undefined1  [24])0x0) &&
              (DumpOpts.ChildRecurseDepth = DVar1.ChildRecurseDepth, DumpOpts.ChildRecurseDepth != 0
              )) && (bVar2 = operator_cast_to_bool((DWARFDie *)&ChildDumpOpts.ShowChildren), bVar2))
          {
            DumpOpts.DumpType = DVar1.DumpType;
            ChildDumpOpts._0_8_ = DumpOpts._8_8_;
            ChildDumpOpts._10_6_ = DVar1._18_6_;
            ChildDumpOpts.ParentRecurseDepth._0_1_ = DVar1.ShowChildren;
            ChildDumpOpts.ParentRecurseDepth._1_1_ = 0;
            while (bVar2 = operator_cast_to_bool((DWARFDie *)&ChildDumpOpts.ShowChildren), bVar2) {
              DVar1._8_8_ = ChildDumpOpts._0_8_;
              DVar1.DumpType = DumpOpts.DumpType;
              DVar1.ChildRecurseDepth = DumpOpts.ChildRecurseDepth - 1;
              DVar1._16_8_ = ChildDumpOpts._8_8_;
              dump((DWARFDie *)&ChildDumpOpts.ShowChildren,OS,debug_info_data.Section._4_4_ + 2,
                   DVar1);
              join_0x00000010_0x00000000_ = getSibling((DWARFDie *)&ChildDumpOpts.ShowChildren);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void DWARFDie::dump(raw_ostream &OS, unsigned Indent,
                    DIDumpOptions DumpOpts) const {
  if (!isValid())
    return;
  DWARFDataExtractor debug_info_data = U->getDebugInfoExtractor();
  const uint64_t Offset = getOffset();
  uint64_t offset = Offset;
  if (DumpOpts.ShowParents) {
    DIDumpOptions ParentDumpOpts = DumpOpts;
    ParentDumpOpts.ShowParents = false;
    ParentDumpOpts.ShowChildren = false;
    Indent = dumpParentChain(getParent(), OS, Indent, ParentDumpOpts);
  }

  if (debug_info_data.isValidOffset(offset)) {
    uint32_t abbrCode = debug_info_data.getULEB128(&offset);
    if (DumpOpts.ShowAddresses)
      WithColor(OS, HighlightColor::Address).get()
          << format("\n0x%8.8" PRIx64 ": ", Offset);

    if (abbrCode) {
      auto AbbrevDecl = getAbbreviationDeclarationPtr();
      if (AbbrevDecl) {
        WithColor(OS, HighlightColor::Tag).get().indent(Indent)
            << formatv("{0}", getTag());
        if (DumpOpts.Verbose)
          OS << format(" [%u] %c", abbrCode,
                       AbbrevDecl->hasChildren() ? '*' : ' ');
        OS << '\n';

        // Dump all data in the DIE for the attributes.
        for (const auto &AttrSpec : AbbrevDecl->attributes()) {
          if (AttrSpec.Form == DW_FORM_implicit_const) {
            // We are dumping .debug_info section ,
            // implicit_const attribute values are not really stored here,
            // but in .debug_abbrev section. So we just skip such attrs.
            continue;
          }
          dumpAttribute(OS, *this, &offset, AttrSpec.Attr, AttrSpec.Form,
                        Indent, DumpOpts);
        }

        DWARFDie child = getFirstChild();
        if (DumpOpts.ShowChildren && DumpOpts.ChildRecurseDepth > 0 && child) {
          DumpOpts.ChildRecurseDepth--;
          DIDumpOptions ChildDumpOpts = DumpOpts;
          ChildDumpOpts.ShowParents = false;
          while (child) {
            child.dump(OS, Indent + 2, ChildDumpOpts);
            child = child.getSibling();
          }
        }
      } else {
        OS << "Abbreviation code not found in 'debug_abbrev' class for code: "
           << abbrCode << '\n';
      }
    } else {
      OS.indent(Indent) << "NULL\n";
    }
  }
}